

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,H10 *hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  uint uVar1;
  size_t last_insert_len_00;
  undefined8 uVar2;
  undefined8 uVar3;
  BackwardMatch *pBVar4;
  int iVar5;
  ulong max_backward_limit_00;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  ZopfliNode *local_1d40;
  ulong local_1d30;
  ulong local_1d18;
  ulong local_1d08;
  uint local_1ce0;
  ulong local_1cd0;
  size_t local_1cc8;
  ulong local_1cb8;
  ulong local_1cb0;
  void *local_1ca0;
  BackwardMatch *local_1c98;
  ulong local_1c90;
  void *local_1c80;
  ulong local_1c70;
  uint32_t *local_1c60;
  size_t skip;
  size_t match_len;
  BackwardMatch *new_array;
  size_t _new_size;
  size_t j;
  size_t cur_match_end;
  size_t num_found_matches;
  size_t max_length;
  size_t max_distance;
  size_t pos;
  BackwardMatch *matches;
  ZopfliNode *nodes;
  ZopfliCostModel model;
  size_t orig_num_commands;
  int orig_dist_cache [4];
  size_t orig_last_insert_len;
  size_t orig_num_literals;
  size_t i;
  size_t cur_match_pos;
  size_t store_end;
  size_t matches_size;
  uint32_t *num_matches;
  size_t max_backward_limit;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  MemoryManager *m_local;
  ulong uStack_810;
  uint32_t dict_id;
  size_t l;
  size_t maxlen;
  size_t minlen;
  size_t len;
  size_t backward;
  size_t prev_ix;
  size_t i_1;
  uint32_t dict_matches [38];
  ulong local_738;
  size_t stop;
  size_t short_match_max_backward;
  size_t best_len;
  size_t cur_ix_masked;
  BackwardMatch *orig_matches;
  BrotliEncoderParams *local_708;
  ulong local_700;
  ulong local_6f8;
  ulong local_6f0;
  size_t local_6e8;
  uint8_t *local_6e0;
  H10 *local_6d8;
  ulong local_6d0;
  undefined8 local_6c8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  ulong local_6a8;
  undefined8 local_6a0;
  ulong local_698;
  size_t j_1;
  size_t i_2;
  ulong local_680;
  ulong local_678;
  uint8_t *local_670;
  H10 *local_668;
  ulong local_660;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_638;
  uint8_t *local_630;
  size_t local_628;
  ulong local_620;
  ulong local_618;
  BackwardMatch *local_610;
  ulong local_608;
  size_t len_1;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward_1;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix_1;
  uint32_t key;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked_1;
  ulong *local_598;
  ulong local_590;
  ulong local_588;
  size_t local_580;
  ulong local_578;
  uint8_t *local_570;
  H10 *local_568;
  size_t local_560;
  size_t local_558;
  undefined8 local_550;
  ulong local_548;
  ulong local_540;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_518;
  uint8_t *local_510;
  size_t local_508;
  ulong local_500;
  size_t local_4f8;
  size_t local_4f0;
  ulong local_4e8;
  ulong local_4e0;
  long local_4d8;
  BackwardMatch *local_4d0;
  ulong local_4c8;
  uint64_t t_7;
  ulong local_4b8;
  uint64_t t_6;
  ulong local_4a8;
  uint64_t t_5;
  ulong local_498;
  uint64_t t_4;
  ulong local_488;
  uint64_t t_3;
  ulong local_478;
  uint64_t t_2;
  ulong local_468;
  uint64_t t_1;
  ulong local_458;
  uint64_t t;
  size_t local_448;
  H10 *local_440;
  size_t local_438;
  H10 *local_430;
  ulong local_428;
  H10 *local_420;
  size_t local_418;
  H10 *local_410;
  size_t local_408;
  H10 *local_400;
  ulong local_3f8;
  H10 *local_3f0;
  ulong local_3e8;
  size_t max_backward;
  ulong local_3d8;
  uint8_t *local_3d0;
  H10 *local_3c8;
  ulong local_3c0;
  size_t len_2;
  size_t cur_len_1;
  size_t prev_ix_masked_1;
  size_t backward_2;
  size_t depth_remaining_1;
  size_t best_len_right_1;
  size_t best_len_left_1;
  size_t node_right_1;
  size_t node_left_1;
  size_t prev_ix_2;
  uint32_t key_1;
  int should_reroot_tree_1;
  size_t max_comp_len_1;
  size_t cur_ix_masked_2;
  ulong *local_350;
  ulong local_348;
  long local_340;
  ulong local_338;
  ulong local_330;
  uint8_t *local_328;
  H10 *local_320;
  size_t local_318;
  size_t local_310;
  undefined8 local_308;
  undefined8 local_300;
  ulong local_2f8;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_2d0;
  uint8_t *local_2c8;
  size_t local_2c0;
  ulong local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  ulong local_2a0;
  uint64_t t_11;
  ulong local_290;
  uint64_t t_10;
  ulong local_280;
  uint64_t t_9;
  ulong local_270;
  uint64_t t_8;
  size_t local_260;
  H10 *local_258;
  size_t local_250;
  H10 *local_248;
  ulong local_240;
  H10 *local_238;
  size_t local_230;
  H10 *local_228;
  size_t local_220;
  H10 *local_218;
  ulong local_210;
  H10 *local_208;
  ulong local_200;
  size_t max_backward_1;
  ulong local_1f0;
  uint8_t *local_1e8;
  H10 *local_1e0;
  ulong local_1d8;
  size_t len_3;
  size_t cur_len_2;
  size_t prev_ix_masked_2;
  size_t backward_3;
  size_t depth_remaining_2;
  size_t best_len_right_2;
  size_t best_len_left_2;
  size_t node_right_2;
  size_t node_left_2;
  size_t prev_ix_3;
  uint32_t key_2;
  int should_reroot_tree_2;
  size_t max_comp_len_2;
  size_t cur_ix_masked_3;
  ulong *local_168;
  ulong local_160;
  long local_158;
  ulong local_150;
  size_t local_148;
  uint8_t *local_140;
  H10 *local_138;
  size_t local_130;
  size_t local_128;
  undefined8 local_120;
  undefined8 local_118;
  ulong local_110;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_e8;
  uint8_t *local_e0;
  size_t local_d8;
  ulong local_d0;
  size_t local_c8;
  size_t local_c0;
  ulong local_b8;
  uint64_t t_15;
  ulong local_a8;
  uint64_t t_14;
  ulong local_98;
  uint64_t t_13;
  ulong local_88;
  uint64_t t_12;
  size_t local_78;
  H10 *local_70;
  size_t local_68;
  H10 *local_60;
  ulong local_58;
  H10 *local_50;
  size_t local_48;
  H10 *local_40;
  size_t local_38;
  H10 *local_30;
  ulong local_28;
  H10 *local_20;
  
  max_backward_limit_00 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  if (num_bytes == 0) {
    local_1c60 = (uint32_t *)0x0;
  }
  else {
    local_1c60 = (uint32_t *)BrotliAllocate(m,num_bytes << 2);
  }
  store_end = num_bytes << 2;
  sVar6 = StoreLookaheadH10();
  local_1c70 = position;
  if (sVar6 <= num_bytes) {
    sVar6 = StoreLookaheadH10();
    local_1c70 = ((position + num_bytes) - sVar6) + 1;
  }
  i = 0;
  if (store_end == 0) {
    local_1c80 = (void *)0x0;
  }
  else {
    local_1c80 = BrotliAllocate(m,num_bytes << 5);
  }
  pos = (size_t)local_1c80;
  orig_num_literals = 0;
  do {
    sVar6 = HashTypeLengthH10();
    if (num_bytes <= (orig_num_literals + sVar6) - 1) {
      sVar6 = *num_literals;
      last_insert_len_00 = *last_insert_len;
      uVar2 = *(undefined8 *)dist_cache;
      uVar3 = *(undefined8 *)(dist_cache + 2);
      model.num_bytes_ = *num_commands;
      if (num_bytes == 0xffffffffffffffff) {
        local_1d40 = (ZopfliNode *)0x0;
      }
      else {
        local_1d40 = (ZopfliNode *)BrotliAllocate(m,(num_bytes + 1) * 0x10);
      }
      InitZopfliCostModel(m,(ZopfliCostModel *)&nodes,num_bytes);
      for (orig_num_literals = 0; orig_num_literals < 2; orig_num_literals = orig_num_literals + 1)
      {
        BrotliInitZopfliNodes(local_1d40,num_bytes + 1);
        if (orig_num_literals == 0) {
          ZopfliCostModelSetFromLiteralCosts
                    ((ZopfliCostModel *)&nodes,position,ringbuffer,ringbuffer_mask);
        }
        else {
          ZopfliCostModelSetFromCommands
                    ((ZopfliCostModel *)&nodes,position,ringbuffer,ringbuffer_mask,commands,
                     *num_commands - model.num_bytes_,last_insert_len_00);
        }
        *num_commands = model.num_bytes_;
        *num_literals = sVar6;
        *last_insert_len = last_insert_len_00;
        *(undefined8 *)dist_cache = uVar2;
        *(undefined8 *)(dist_cache + 2) = uVar3;
        sVar12 = ZopfliIterate(num_bytes,position,ringbuffer,ringbuffer_mask,params,
                               max_backward_limit_00,dist_cache,(ZopfliCostModel *)&nodes,local_1c60
                               ,(BackwardMatch *)pos,local_1d40);
        *num_commands = sVar12 + *num_commands;
        BrotliZopfliCreateCommands
                  (num_bytes,position,max_backward_limit_00,local_1d40,dist_cache,last_insert_len,
                   commands,num_literals);
      }
      CleanupZopfliCostModel(m,(ZopfliCostModel *)&nodes);
      BrotliFree(m,local_1d40);
      BrotliFree(m,(void *)pos);
      BrotliFree(m,local_1c60);
      return;
    }
    uVar7 = position + orig_num_literals;
    local_1c90 = max_backward_limit_00;
    if (uVar7 < max_backward_limit_00) {
      local_1c90 = uVar7;
    }
    uVar8 = num_bytes - orig_num_literals;
    if (store_end < i + 0x80) {
      if (store_end == 0) {
        local_1c98 = (BackwardMatch *)(i + 0x80);
      }
      else {
        local_1c98 = (BackwardMatch *)store_end;
      }
      for (new_array = local_1c98; new_array < (BackwardMatch *)(i + 0x80);
          new_array = (BackwardMatch *)((long)new_array << 1)) {
      }
      if (new_array == (BackwardMatch *)0x0) {
        local_1ca0 = (void *)0x0;
      }
      else {
        local_1ca0 = BrotliAllocate(m,(long)new_array << 3);
      }
      if (store_end != 0) {
        memcpy(local_1ca0,(void *)pos,store_end << 3);
      }
      BrotliFree(m,(void *)pos);
      pos = (size_t)local_1ca0;
      store_end = (size_t)new_array;
    }
    cur_ix_masked = pos + i * 8;
    local_6d8 = hasher;
    local_700 = local_1c90;
    best_len = uVar7 & ringbuffer_mask;
    short_match_max_backward = 1;
    iVar5 = 0x40;
    if (params->quality != 0xb) {
      iVar5 = 0x10;
    }
    local_738 = uVar7 - (long)iVar5;
    orig_matches = (BackwardMatch *)cur_ix_masked;
    prev_ix = uVar7;
    if (uVar7 < (ulong)(long)iVar5) {
      local_738 = 0;
      orig_matches = (BackwardMatch *)cur_ix_masked;
    }
    while ((prev_ix = prev_ix - 1, local_738 < prev_ix && short_match_max_backward < 3 &&
           (uVar9 = uVar7 - prev_ix, uVar9 <= local_1c90))) {
      uVar10 = ringbuffer_mask & prev_ix;
      if ((ringbuffer[best_len] == ringbuffer[uVar10]) &&
         (ringbuffer[best_len + 1] == ringbuffer[uVar10 + 1])) {
        local_630 = ringbuffer + uVar10;
        local_638 = (ulong *)(ringbuffer + best_len);
        limit2 = 0;
        x = (uVar8 >> 3) + 1;
LAB_0012af28:
        x = x - 1;
        if (x != 0) {
          t = (uint64_t)local_638;
          local_458 = *local_638;
          t_1 = (uint64_t)(local_630 + limit2);
          local_468 = *(ulong *)t_1;
          if (local_458 == local_468) goto LAB_0012afa6;
          t_2 = (uint64_t)local_638;
          local_478 = *local_638;
          t_3 = (uint64_t)(local_630 + limit2);
          local_488 = *(ulong *)t_3;
          iVar5 = 0;
          matching_bits = local_478 ^ local_488;
          for (uVar10 = matching_bits; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000)
          {
            iVar5 = iVar5 + 1;
          }
          local_660 = (ulong)iVar5;
          local_628 = (local_660 >> 3) + limit2;
          matched = uVar8;
          goto LAB_0012b103;
        }
        matched = (uVar8 & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (local_630[limit2] != (uint8_t)*local_638) {
            local_628 = limit2;
            goto LAB_0012b103;
          }
          local_638 = (ulong *)((long)local_638 + 1);
          limit2 = limit2 + 1;
        }
        local_628 = limit2;
LAB_0012b103:
        limit2 = local_628;
        if (short_match_max_backward < local_628) {
          short_match_max_backward = local_628;
          local_610 = orig_matches;
          local_620 = local_628;
          orig_matches->distance = (uint32_t)uVar9;
          orig_matches->length_and_code = (uint32_t)(local_628 << 5);
          orig_matches = orig_matches + 1;
          local_618 = uVar9;
        }
      }
    }
    local_708 = params;
    local_6f8 = uVar8;
    local_6f0 = uVar7;
    local_6e8 = ringbuffer_mask;
    local_6e0 = ringbuffer;
    if (short_match_max_backward < uVar8) {
      local_568 = hasher;
      local_590 = local_1c90;
      local_598 = &short_match_max_backward;
      cur_ix_masked_1 = (size_t)orig_matches;
      max_comp_len = uVar7 & ringbuffer_mask;
      local_550 = 0x80;
      local_1cb0 = uVar8;
      if (0x7f < uVar8) {
        local_1cb0 = 0x80;
      }
      _key = local_1cb0;
      prev_ix_1._4_4_ = (uint)(0x7f < uVar8);
      local_588 = uVar8;
      local_580 = ringbuffer_mask;
      local_578 = uVar7;
      local_570 = ringbuffer;
      local_548 = uVar8;
      prev_ix_1._0_4_ = HashBytesH10(ringbuffer + max_comp_len);
      uVar1 = local_568->buckets_[(uint32_t)prev_ix_1];
      local_420 = local_568;
      local_428 = local_578;
      node_right = (local_578 & local_568->window_mask_) << 1;
      local_3f0 = local_568;
      local_3f8 = local_578;
      best_len_left = (local_578 & local_568->window_mask_) * 2 + 1;
      best_len_right = 0;
      depth_remaining = 0;
      if (prev_ix_1._4_4_ != 0) {
        local_568->buckets_[(uint32_t)prev_ix_1] = (uint32_t)local_578;
      }
      backward_1 = 0x40;
      while( true ) {
        node_left = (size_t)uVar1;
        prev_ix_masked = local_578 - node_left;
        cur_len = node_left & local_580;
        if (((prev_ix_masked == 0) || (local_590 < prev_ix_masked)) || (backward_1 == 0)) break;
        local_558 = best_len_right;
        local_560 = depth_remaining;
        if (best_len_right < depth_remaining) {
          local_1cb8 = best_len_right;
        }
        else {
          local_1cb8 = depth_remaining;
        }
        len_1 = local_1cb8;
        if (0x80 < local_1cb8) {
          __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0x9d,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        local_510 = local_570 + max_comp_len + local_1cb8;
        local_518 = (ulong *)(local_570 + cur_len + local_1cb8);
        matched_1 = local_588 - local_1cb8;
        limit2_1 = 0;
        x_1 = (matched_1 >> 3) + 1;
LAB_0012b54e:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          t_4 = (uint64_t)local_518;
          local_498 = *local_518;
          t_5 = (uint64_t)(local_510 + limit2_1);
          local_4a8 = *(ulong *)t_5;
          if (local_498 == local_4a8) goto LAB_0012b5cc;
          t_6 = (uint64_t)local_518;
          local_4b8 = *local_518;
          t_7 = (uint64_t)(local_510 + limit2_1);
          local_4c8 = *(ulong *)t_7;
          iVar5 = 0;
          matching_bits_1 = local_4b8 ^ local_4c8;
          for (uVar8 = matching_bits_1; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
            iVar5 = iVar5 + 1;
          }
          local_540 = (ulong)iVar5;
          local_508 = (local_540 >> 3) + limit2_1;
          goto LAB_0012b729;
        }
        matched_1 = (matched_1 & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (local_510[limit2_1] != (uint8_t)*local_518) {
            local_508 = limit2_1;
            goto LAB_0012b729;
          }
          local_518 = (ulong *)((long)local_518 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_508 = limit2_1;
LAB_0012b729:
        local_608 = local_1cb8 + local_508;
        limit2_1 = local_508;
        iVar5 = memcmp(local_570 + max_comp_len,local_570 + cur_len,local_608);
        if (iVar5 != 0) {
          __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0xa2,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        if ((cur_ix_masked_1 != 0) && (*local_598 < local_608)) {
          *local_598 = local_608;
          local_4f0 = cur_ix_masked_1;
          local_4f8 = prev_ix_masked;
          local_500 = local_608;
          *(int *)cur_ix_masked_1 = (int)prev_ix_masked;
          *(int *)(cur_ix_masked_1 + 4) = (int)(local_608 << 5);
          cur_ix_masked_1 = cur_ix_masked_1 + 8;
        }
        if (_key <= local_608) {
          if (prev_ix_1._4_4_ != 0) {
            local_440 = local_568;
            local_448 = node_left;
            local_568->forest_[node_right] =
                 local_568->forest_[(node_left & local_568->window_mask_) * 2];
            local_410 = local_568;
            local_418 = node_left;
            local_568->forest_[best_len_left] =
                 local_568->forest_[(node_left & local_568->window_mask_) * 2 + 1];
          }
          goto LAB_0012ba70;
        }
        if (local_570[cur_len + local_608] < local_570[max_comp_len + local_608]) {
          best_len_right = local_608;
          if (prev_ix_1._4_4_ != 0) {
            local_568->forest_[node_right] = (uint32_t)node_left;
          }
          local_400 = local_568;
          local_408 = node_left;
          node_right = (node_left & local_568->window_mask_) * 2 + 1;
          uVar1 = local_568->forest_[node_right];
        }
        else {
          depth_remaining = local_608;
          if (prev_ix_1._4_4_ != 0) {
            local_568->forest_[best_len_left] = (uint32_t)node_left;
          }
          local_430 = local_568;
          local_438 = node_left;
          uVar8 = node_left & local_568->window_mask_;
          best_len_left = uVar8 * 2;
          uVar1 = local_568->forest_[uVar8 * 2];
        }
        backward_1 = backward_1 - 1;
      }
      if (prev_ix_1._4_4_ != 0) {
        local_568->forest_[node_right] = local_568->invalid_pos_;
        local_568->forest_[best_len_left] = local_568->invalid_pos_;
      }
LAB_0012ba70:
      orig_matches = (BackwardMatch *)cur_ix_masked_1;
    }
    for (prev_ix = 0; prev_ix < 0x26; prev_ix = prev_ix + 1) {
      dict_matches[prev_ix - 2] = 0xfffffff;
    }
    local_6a8 = short_match_max_backward + 1;
    local_6a0 = 4;
    local_1cc8 = local_6a8;
    if (local_6a8 < 4) {
      local_1cc8 = 4;
    }
    iVar5 = BrotliFindAllStaticDictionaryMatches
                      (local_6e0 + best_len,local_1cc8,local_6f8,(uint32_t *)&i_1);
    if (iVar5 != 0) {
      local_6c8 = 0x25;
      local_6d0 = local_6f8;
      if (local_6f8 < 0x26) {
        local_1cd0 = local_6f8;
      }
      else {
        local_1cd0 = 0x25;
      }
      for (uStack_810 = local_1cc8; pBVar4 = orig_matches, uStack_810 <= local_1cd0;
          uStack_810 = uStack_810 + 1) {
        local_1ce0 = dict_matches[uStack_810 - 2];
        if (local_1ce0 < 0xfffffff) {
          orig_matches = orig_matches + 1;
          local_4d8 = local_700 + (local_1ce0 >> 5) + 1;
          local_1ce0 = local_1ce0 & 0x1f;
          local_4d0 = pBVar4;
          local_4e0 = uStack_810;
          local_4e8 = (ulong)local_1ce0;
          pBVar4->distance = (uint32_t)local_4d8;
          if (uStack_810 == local_1ce0) {
            local_1ce0 = 0;
          }
          pBVar4->length_and_code = (uint)(uStack_810 << 5) | local_1ce0;
        }
      }
    }
    lVar11 = (long)((long)orig_matches - cur_ix_masked) >> 3;
    uVar8 = i + lVar11;
    for (_new_size = i; _new_size + 1 < uVar8; _new_size = _new_size + 1) {
      local_6b0 = pos + _new_size * 8;
      local_6b8 = pos + (_new_size + 1) * 8;
      if (*(uint *)(local_6b8 + 4) >> 5 <= *(uint *)(local_6b0 + 4) >> 5) {
        __assert_fail("BackwardMatchLength(&matches[j]) < BackwardMatchLength(&matches[j + 1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/backward_references_hq.c"
                      ,0x2d3,
                      "void BrotliCreateHqZopfliBackwardReferences(MemoryManager *, size_t, size_t, const uint8_t *, size_t, const BrotliEncoderParams *, H10 *, int *, size_t *, Command *, size_t *, size_t *)"
                     );
      }
      if ((*(uint *)(pos + _new_size * 8) <= local_1c90) &&
         (*(uint *)(pos + 8 + _new_size * 8) < *(uint *)(pos + _new_size * 8))) {
        __assert_fail("matches[j].distance > max_distance || matches[j].distance <= matches[j + 1].distance"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/backward_references_hq.c"
                      ,0x2d5,
                      "void BrotliCreateHqZopfliBackwardReferences(MemoryManager *, size_t, size_t, const uint8_t *, size_t, const BrotliEncoderParams *, H10 *, int *, size_t *, Command *, size_t *, size_t *)"
                     );
      }
    }
    local_1c60[orig_num_literals] = (uint32_t)lVar11;
    sVar6 = i;
    if (lVar11 != 0) {
      local_6c0 = pos + (uVar8 - 1) * 8;
      uVar9 = (ulong)(*(uint *)(local_6c0 + 4) >> 5);
      sVar6 = uVar8;
      if (0x145 < uVar9) {
        *(undefined8 *)(pos + i * 8) = *(undefined8 *)(pos + (uVar8 - 1) * 8);
        local_1c60[orig_num_literals] = 1;
        local_698 = uVar7 + 1;
        local_1d08 = uVar7 + uVar9;
        if (local_1c70 <= local_1d08) {
          local_1d08 = local_1c70;
        }
        local_668 = hasher;
        i_2 = local_1d08;
        j_1 = local_698;
        if (uVar7 + 0x40 <= local_1d08) {
          j_1 = local_1d08 - 0x3f;
        }
        local_680 = local_698;
        local_678 = ringbuffer_mask;
        local_670 = ringbuffer;
        if (uVar7 + 0x201 <= j_1) {
          for (; local_698 < j_1; local_698 = local_698 + 8) {
            local_3c8 = local_668;
            local_3d0 = local_670;
            local_3d8 = local_678;
            max_backward = local_698;
            local_3e8 = local_668->window_mask_ - 0xf;
            local_320 = local_668;
            local_328 = local_670;
            local_330 = local_698;
            local_338 = local_678;
            local_340 = 0x80;
            local_350 = (ulong *)0x0;
            cur_ix_masked_2 = 0;
            max_comp_len_1 = local_698 & local_678;
            local_300 = 0x80;
            local_308 = 0x80;
            _key_1 = 0x80;
            prev_ix_2._4_4_ = 1;
            local_348 = local_3e8;
            prev_ix_2._0_4_ = HashBytesH10(local_670 + max_comp_len_1);
            uVar1 = local_320->buckets_[(uint32_t)prev_ix_2];
            local_238 = local_320;
            local_240 = local_330;
            node_right_1 = (local_330 & local_320->window_mask_) << 1;
            local_208 = local_320;
            local_210 = local_330;
            best_len_left_1 = (local_330 & local_320->window_mask_) * 2 + 1;
            best_len_right_1 = 0;
            depth_remaining_1 = 0;
            if (prev_ix_2._4_4_ != 0) {
              local_320->buckets_[(uint32_t)prev_ix_2] = (uint32_t)local_330;
            }
            backward_2 = 0x40;
            while( true ) {
              node_left_1 = (size_t)uVar1;
              prev_ix_masked_1 = local_330 - node_left_1;
              cur_len_1 = node_left_1 & local_338;
              if (((prev_ix_masked_1 == 0) || (local_348 < prev_ix_masked_1)) || (backward_2 == 0))
              break;
              local_310 = best_len_right_1;
              local_318 = depth_remaining_1;
              if (best_len_right_1 < depth_remaining_1) {
                local_1d18 = best_len_right_1;
              }
              else {
                local_1d18 = depth_remaining_1;
              }
              len_2 = local_1d18;
              if (0x80 < local_1d18) {
                __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                              ,0x9d,
                              "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                             );
              }
              local_2c8 = local_328 + max_comp_len_1 + local_1d18;
              local_2d0 = (ulong *)(local_328 + cur_len_1 + local_1d18);
              matched_2 = local_340 - local_1d18;
              limit2_2 = 0;
              x_2 = (matched_2 >> 3) + 1;
LAB_0012c3f4:
              x_2 = x_2 - 1;
              if (x_2 != 0) {
                t_8 = (uint64_t)local_2d0;
                local_270 = *local_2d0;
                t_9 = (uint64_t)(local_2c8 + limit2_2);
                local_280 = *(ulong *)t_9;
                if (local_270 == local_280) goto LAB_0012c472;
                t_10 = (uint64_t)local_2d0;
                local_290 = *local_2d0;
                t_11 = (uint64_t)(local_2c8 + limit2_2);
                local_2a0 = *(ulong *)t_11;
                iVar5 = 0;
                matching_bits_2 = local_290 ^ local_2a0;
                for (uVar7 = matching_bits_2; (uVar7 & 1) == 0;
                    uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                  iVar5 = iVar5 + 1;
                }
                local_2f8 = (ulong)iVar5;
                local_2c0 = (local_2f8 >> 3) + limit2_2;
                goto LAB_0012c5cf;
              }
              matched_2 = (matched_2 & 7) + 1;
              while (matched_2 = matched_2 - 1, matched_2 != 0) {
                if (local_2c8[limit2_2] != (uint8_t)*local_2d0) {
                  local_2c0 = limit2_2;
                  goto LAB_0012c5cf;
                }
                local_2d0 = (ulong *)((long)local_2d0 + 1);
                limit2_2 = limit2_2 + 1;
              }
              local_2c0 = limit2_2;
LAB_0012c5cf:
              local_3c0 = local_1d18 + local_2c0;
              limit2_2 = local_2c0;
              iVar5 = memcmp(local_328 + max_comp_len_1,local_328 + cur_len_1,local_3c0);
              if (iVar5 != 0) {
                __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                              ,0xa2,
                              "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                             );
              }
              if ((cur_ix_masked_2 != 0) && (*local_350 < local_3c0)) {
                *local_350 = local_3c0;
                local_2a8 = cur_ix_masked_2;
                local_2b0 = prev_ix_masked_1;
                local_2b8 = local_3c0;
                *(int *)cur_ix_masked_2 = (int)prev_ix_masked_1;
                *(int *)(cur_ix_masked_2 + 4) = (int)(local_3c0 << 5);
                cur_ix_masked_2 = cur_ix_masked_2 + 8;
              }
              if (_key_1 <= local_3c0) {
                if (prev_ix_2._4_4_ != 0) {
                  local_258 = local_320;
                  local_260 = node_left_1;
                  local_320->forest_[node_right_1] =
                       local_320->forest_[(node_left_1 & local_320->window_mask_) * 2];
                  local_228 = local_320;
                  local_230 = node_left_1;
                  local_320->forest_[best_len_left_1] =
                       local_320->forest_[(node_left_1 & local_320->window_mask_) * 2 + 1];
                }
                goto LAB_0012c916;
              }
              if (local_328[cur_len_1 + local_3c0] < local_328[max_comp_len_1 + local_3c0]) {
                best_len_right_1 = local_3c0;
                if (prev_ix_2._4_4_ != 0) {
                  local_320->forest_[node_right_1] = (uint32_t)node_left_1;
                }
                local_218 = local_320;
                local_220 = node_left_1;
                node_right_1 = (node_left_1 & local_320->window_mask_) * 2 + 1;
                uVar1 = local_320->forest_[node_right_1];
              }
              else {
                depth_remaining_1 = local_3c0;
                if (prev_ix_2._4_4_ != 0) {
                  local_320->forest_[best_len_left_1] = (uint32_t)node_left_1;
                }
                local_248 = local_320;
                local_250 = node_left_1;
                uVar7 = node_left_1 & local_320->window_mask_;
                best_len_left_1 = uVar7 * 2;
                uVar1 = local_320->forest_[uVar7 * 2];
              }
              backward_2 = backward_2 - 1;
            }
            if (prev_ix_2._4_4_ != 0) {
              local_320->forest_[node_right_1] = local_320->invalid_pos_;
              local_320->forest_[best_len_left_1] = local_320->invalid_pos_;
            }
LAB_0012c916:
          }
        }
        for (; j_1 < i_2; j_1 = j_1 + 1) {
          local_1e0 = local_668;
          local_1e8 = local_670;
          local_1f0 = local_678;
          max_backward_1 = j_1;
          local_200 = local_668->window_mask_ - 0xf;
          local_138 = local_668;
          local_140 = local_670;
          local_148 = j_1;
          local_150 = local_678;
          local_158 = 0x80;
          local_168 = (ulong *)0x0;
          cur_ix_masked_3 = 0;
          max_comp_len_2 = j_1 & local_678;
          local_118 = 0x80;
          local_120 = 0x80;
          _key_2 = 0x80;
          prev_ix_3._4_4_ = 1;
          local_160 = local_200;
          prev_ix_3._0_4_ = HashBytesH10(local_670 + max_comp_len_2);
          uVar1 = local_138->buckets_[(uint32_t)prev_ix_3];
          local_50 = local_138;
          local_58 = local_148;
          node_right_2 = (local_148 & local_138->window_mask_) << 1;
          local_20 = local_138;
          local_28 = local_148;
          best_len_left_2 = (local_148 & local_138->window_mask_) * 2 + 1;
          best_len_right_2 = 0;
          depth_remaining_2 = 0;
          if (prev_ix_3._4_4_ != 0) {
            local_138->buckets_[(uint32_t)prev_ix_3] = (uint32_t)local_148;
          }
          backward_3 = 0x40;
          while( true ) {
            node_left_2 = (size_t)uVar1;
            prev_ix_masked_2 = local_148 - node_left_2;
            cur_len_2 = node_left_2 & local_150;
            if (((prev_ix_masked_2 == 0) || (local_160 < prev_ix_masked_2)) || (backward_3 == 0))
            break;
            local_128 = best_len_right_2;
            local_130 = depth_remaining_2;
            if (best_len_right_2 < depth_remaining_2) {
              local_1d30 = best_len_right_2;
            }
            else {
              local_1d30 = depth_remaining_2;
            }
            len_3 = local_1d30;
            if (0x80 < local_1d30) {
              __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                            ,0x9d,
                            "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                           );
            }
            local_e0 = local_140 + max_comp_len_2 + local_1d30;
            local_e8 = (ulong *)(local_140 + cur_len_2 + local_1d30);
            matched_3 = local_158 - local_1d30;
            limit2_3 = 0;
            x_3 = (matched_3 >> 3) + 1;
LAB_0012cd06:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              t_12 = (uint64_t)local_e8;
              local_88 = *local_e8;
              t_13 = (uint64_t)(local_e0 + limit2_3);
              local_98 = *(ulong *)t_13;
              if (local_88 == local_98) goto LAB_0012cd78;
              t_14 = (uint64_t)local_e8;
              local_a8 = *local_e8;
              t_15 = (uint64_t)(local_e0 + limit2_3);
              local_b8 = *(ulong *)t_15;
              iVar5 = 0;
              matching_bits_3 = local_a8 ^ local_b8;
              for (uVar7 = matching_bits_3; (uVar7 & 1) == 0;
                  uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                iVar5 = iVar5 + 1;
              }
              local_110 = (ulong)iVar5;
              local_d8 = (local_110 >> 3) + limit2_3;
              goto LAB_0012ced5;
            }
            matched_3 = (matched_3 & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (local_e0[limit2_3] != (uint8_t)*local_e8) {
                local_d8 = limit2_3;
                goto LAB_0012ced5;
              }
              local_e8 = (ulong *)((long)local_e8 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_d8 = limit2_3;
LAB_0012ced5:
            local_1d8 = local_1d30 + local_d8;
            limit2_3 = local_d8;
            iVar5 = memcmp(local_140 + max_comp_len_2,local_140 + cur_len_2,local_1d8);
            if (iVar5 != 0) {
              __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                            ,0xa2,
                            "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                           );
            }
            if ((cur_ix_masked_3 != 0) && (*local_168 < local_1d8)) {
              *local_168 = local_1d8;
              local_c0 = cur_ix_masked_3;
              local_c8 = prev_ix_masked_2;
              local_d0 = local_1d8;
              *(int *)cur_ix_masked_3 = (int)prev_ix_masked_2;
              *(int *)(cur_ix_masked_3 + 4) = (int)(local_1d8 << 5);
              cur_ix_masked_3 = cur_ix_masked_3 + 8;
            }
            if (_key_2 <= local_1d8) {
              if (prev_ix_3._4_4_ != 0) {
                local_70 = local_138;
                local_78 = node_left_2;
                local_138->forest_[node_right_2] =
                     local_138->forest_[(node_left_2 & local_138->window_mask_) * 2];
                local_40 = local_138;
                local_48 = node_left_2;
                local_138->forest_[best_len_left_2] =
                     local_138->forest_[(node_left_2 & local_138->window_mask_) * 2 + 1];
              }
              goto LAB_0012d1ec;
            }
            if (local_140[cur_len_2 + local_1d8] < local_140[max_comp_len_2 + local_1d8]) {
              best_len_right_2 = local_1d8;
              if (prev_ix_3._4_4_ != 0) {
                local_138->forest_[node_right_2] = (uint32_t)node_left_2;
              }
              local_30 = local_138;
              local_38 = node_left_2;
              node_right_2 = (node_left_2 & local_138->window_mask_) * 2 + 1;
              uVar1 = local_138->forest_[node_right_2];
            }
            else {
              depth_remaining_2 = local_1d8;
              if (prev_ix_3._4_4_ != 0) {
                local_138->forest_[best_len_left_2] = (uint32_t)node_left_2;
              }
              local_60 = local_138;
              local_68 = node_left_2;
              uVar7 = node_left_2 & local_138->window_mask_;
              best_len_left_2 = uVar7 * 2;
              uVar1 = local_138->forest_[uVar7 * 2];
            }
            backward_3 = backward_3 - 1;
          }
          if (prev_ix_3._4_4_ != 0) {
            local_138->forest_[node_right_2] = local_138->invalid_pos_;
            local_138->forest_[best_len_left_2] = local_138->invalid_pos_;
          }
LAB_0012d1ec:
        }
        memset(local_1c60 + orig_num_literals + 1,0,(uVar9 - 1) * 4);
        orig_num_literals = (uVar9 - 1) + orig_num_literals;
        sVar6 = i + 1;
      }
    }
    i = sVar6;
    orig_num_literals = orig_num_literals + 1;
  } while( true );
LAB_0012b5cc:
  local_518 = local_518 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0012b54e;
LAB_0012c472:
  local_2d0 = local_2d0 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_0012c3f4;
LAB_0012cd78:
  local_e8 = local_e8 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_0012cd06;
LAB_0012afa6:
  local_638 = local_638 + 1;
  limit2 = limit2 + 8;
  goto LAB_0012af28;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(
    MemoryManager* m, size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, H10* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(hasher, ringbuffer, ringbuffer_mask,
        pos, max_length, max_distance, params, &matches[cur_match_pos]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      assert(BackwardMatchLength(&matches[j]) <
          BackwardMatchLength(&matches[j + 1]));
      assert(matches[j].distance > max_distance ||
             matches[j].distance <= matches[j + 1].distance);
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  InitZopfliCostModel(m, &model, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, max_backward_limit, dist_cache,
        &model, num_matches, matches, nodes);
    BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit,
        nodes, dist_cache, last_insert_len, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}